

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fetch.hpp
# Opt level: O2

void __thiscall
TI::TMS::TextSequencer<(TI::TMS::Personality)3>::fetch<150>
          (TextSequencer<(TI::TMS::Personality)3> *this)

{
  Base<(TI::TMS::Personality)3>::do_external_slot((this->fetcher).base,300);
  return;
}

Assistant:

void fetch() {
		// The first 30 and the final 4 slots are external.
		if constexpr (cycle < 30 || cycle >= 150) {
			fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
			return;
		} else {
			// For the 120 slots in between follow a three-step pattern of:
			constexpr int offset = cycle - 30;
			constexpr auto column = AddressT(offset / 3);
			switch(offset % 3) {
				case 0:		// (1) fetch tile name.
					fetcher.fetch_name(column);
				break;
				case 1:		// (2) external slot.
					fetcher.base->do_external_slot(to_internal<personality, Clock::TMSMemoryWindow, Clock::FromStartOfSync>(cycle));
				break;
				case 2:		// (3) fetch tile pattern.
					fetcher.fetch_pattern(column);
				break;
			}
		}
	}